

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O2

void ZXing::Pdf417::EncodeNumeric
               (wstring *msg,int startpos,int count,vector<int,_std::allocator<int>_> *output)

{
  int iVar1;
  int iVar2;
  int local_fc;
  vector<int,_std::allocator<int>_> tmp;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_c0;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  BigInteger bigint;
  BigInteger r;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> part;
  BigInteger num900;
  
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&tmp,(long)(count / 3 + 1));
  BigInteger::BigInteger<int>
            (&num900,900,(enable_if_t<std::is_integral_v<int>_&&_std::is_signed_v<int>_> *)0x0);
  for (iVar2 = 0; iVar1 = count - iVar2, iVar1 != 0 && iVar2 <= count; iVar2 = iVar1 + iVar2) {
    if (tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        != tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
    }
    if (0x2b < iVar1) {
      iVar1 = 0x2c;
    }
    std::__cxx11::wstring::substr((ulong)&bigint,(ulong)msg);
    std::operator+(&part,L"1",
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &bigint);
    std::__cxx11::wstring::~wstring((wstring *)&bigint);
    bigint.negative = false;
    bigint.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bigint.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bigint.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    r.negative = false;
    r.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    r.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    r.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BigInteger::TryParse(&part,&bigint);
    do {
      BigInteger::Divide(&bigint,&num900,&bigint,&r);
      local_fc = BigInteger::toInt(&r);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tmp,&local_fc);
    } while (bigint.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             bigint.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
    local_b8.current._M_current =
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
         tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    local_c0.current._M_current =
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
         tmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    std::vector<int,std::allocator<int>>::
    insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,void>
              ((vector<int,std::allocator<int>> *)output,
               (const_iterator)
               (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_b8,&local_c0);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&r.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&bigint.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::wstring::~wstring((wstring *)&part);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&num900.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tmp.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void EncodeNumeric(const std::wstring& msg, int startpos, int count, std::vector<int>& output)
{
	int idx = 0;
	std::vector<int> tmp;
	tmp.reserve(count / 3 + 1);
	BigInteger num900(900);
	while (idx < count) {
		tmp.clear();
		int len = std::min(44, count - idx);
		auto part = L"1" + msg.substr(startpos + idx, len);

		BigInteger bigint, r;
		BigInteger::TryParse(part, bigint);
		do {
			BigInteger::Divide(bigint, num900, bigint, r);
			tmp.push_back(r.toInt());
		} while (!bigint.isZero());

		//Reverse temporary string
		output.insert(output.end(), tmp.rbegin(), tmp.rend());
		idx += len;
	}
}